

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadjointcheckpointscheme_fixed.c
# Opt level: O0

SUNErrCode SUNAdjointCheckpointScheme_Destroy_Fixed(SUNAdjointCheckpointScheme *self_ptr)

{
  undefined8 *__ptr;
  undefined8 *in_RDI;
  SUNAdjointCheckpointScheme self;
  SUNContext sunctx_local_scope_;
  
  __ptr = (undefined8 *)*in_RDI;
  SUNDataNode_Destroy(__ptr[1] + 0x28);
  free((void *)__ptr[1]);
  free((void *)*__ptr);
  free(__ptr);
  *in_RDI = 0;
  return 0;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_Destroy_Fixed(
  SUNAdjointCheckpointScheme* self_ptr)
{
  SUNFunctionBegin((*self_ptr)->sunctx);

  SUNAdjointCheckpointScheme self = *self_ptr;

  SUNCheckCall(SUNDataNode_Destroy(&IMPL_MEMBER(self, root_node)));

  free(self->content);
  free(self->ops);
  free(self);

  *self_ptr = NULL;

  return SUN_SUCCESS;
}